

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  pointer pbVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  RegularExpression *this_00;
  string *this_01;
  _Alloc_hider in_R8;
  Repeat RVar10;
  cmDuration cVar11;
  string_view value;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view varg1;
  string_view prefix;
  string_view prefix_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view varg1_00;
  string_view varg1_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view varg1_02;
  string_view varg1_03;
  string_view varg1_04;
  string_view varg1_05;
  string_view varg1_06;
  string_view varg1_07;
  string_view varg1_08;
  string_view varg1_09;
  string_view varg1_10;
  string_view varg1_11;
  string_view varg1_12;
  string_view varg1_13;
  string_view varg1_14;
  string_view varg1_15;
  string_view varg1_16;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string arg;
  string format;
  unsigned_long load;
  pointer local_1f0;
  RegularExpression repeatRegex;
  long repeat;
  
  std::__cxx11::string::string
            ((string *)&arg,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *i));
  bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,(string_view)ZEXT816(0x690c1e),in_R8._M_p);
  if (bVar3) {
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Failover = true;
LAB_0044bab2:
    str_00._M_str = arg._M_dataplus._M_p;
    str_00._M_len = arg._M_string_length;
    prefix_00._M_str = "--no-tests=";
    prefix_00._M_len = 0xb;
    bVar3 = cmHasPrefix(str_00,prefix_00);
    if (bVar3) {
      repeatRegex.regmatch.startp[0] = (char *)arg._M_string_length;
      repeatRegex.regmatch.startp[1] = arg._M_dataplus._M_p;
      __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&repeatRegex,0xb,
                       0xffffffffffffffff);
      __y._M_str = "error";
      __y._M_len = 5;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Error;
      }
      else {
        __y_00._M_str = "ignore";
        __y_00._M_len = 6;
        bVar3 = std::operator!=(__x,__y_00);
        if (bVar3) {
          repeatRegex.regmatch.startp[0] = (char *)0x23;
          repeatRegex.regmatch.startp[1] = "\'--no-tests=\' given unknown value \'";
          repeat = CONCAT71(repeat._1_7_,0x27);
          format._0_16_ = __x;
          cmStrCat<char>((string *)&load,(cmAlphaNum *)&repeatRegex,(cmAlphaNum *)&format,
                         (char *)&repeat);
          goto LAB_0044bd1c;
        }
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Ignore;
      }
    }
    else {
      varg1_00._M_str = "--tests-information";
      varg1_00._M_len = (size_t)"-I";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_00,in_R8._M_p);
      if ((bVar3) &&
         (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        *i = *i + 1;
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&repeatRegex,"TestsToRunInformation",(allocator<char> *)&format);
        cmCTestGenericHandler::SetPersistentOption
                  (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                   (string *)&repeatRegex,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&repeatRegex);
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&repeatRegex,"TestsToRunInformation",(allocator<char> *)&format);
        cmCTestGenericHandler::SetPersistentOption
                  ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                   (string *)&repeatRegex,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      }
      else {
        varg1_01._M_str = "--union";
        varg1_01._M_len = (size_t)"-U";
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_01,in_R8._M_p);
        if (bVar3) {
          _Var2._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&repeatRegex,"UseUnion",(allocator<char> *)&format);
          cmCTestGenericHandler::SetPersistentOption
                    (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                     (string *)&repeatRegex,"true");
          std::__cxx11::string::~string((string *)&repeatRegex);
          _Var2._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&repeatRegex,"UseUnion",(allocator<char> *)&format);
          cmCTestGenericHandler::SetPersistentOption
                    ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                     (string *)&repeatRegex,"true");
        }
        else {
          varg1_02._M_str = "--tests-regex";
          varg1_02._M_len = (size_t)"-R";
          bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_02,in_R8._M_p);
          if ((bVar3) &&
             (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            *i = *i + 1;
            _Var2._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&repeatRegex,"IncludeRegularExpression",(allocator<char> *)&format)
            ;
            cmCTestGenericHandler::SetPersistentOption
                      (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                       (string *)&repeatRegex,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&repeatRegex);
            _Var2._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&repeatRegex,"IncludeRegularExpression",(allocator<char> *)&format)
            ;
            cmCTestGenericHandler::SetPersistentOption
                      ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                       (string *)&repeatRegex,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
          }
          else {
            varg1_03._M_str = "--label-regex";
            varg1_03._M_len = (size_t)"-L";
            bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_03,in_R8._M_p);
            if ((bVar3) &&
               (*i < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              *i = *i + 1;
              _Var2._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&repeatRegex,"LabelRegularExpression",(allocator<char> *)&format)
              ;
              cmCTestGenericHandler::AddPersistentMultiOption
                        (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                         (string *)&repeatRegex,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
              std::__cxx11::string::~string((string *)&repeatRegex);
              _Var2._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&repeatRegex,"LabelRegularExpression",(allocator<char> *)&format)
              ;
              cmCTestGenericHandler::AddPersistentMultiOption
                        ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                         (string *)&repeatRegex,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
            }
            else {
              varg1_04._M_str = "--label-exclude";
              varg1_04._M_len = (size_t)"-LE";
              bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x3,varg1_04,in_R8._M_p);
              if ((bVar3) &&
                 (*i < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                *i = *i + 1;
                _Var2._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&repeatRegex,"ExcludeLabelRegularExpression",
                           (allocator<char> *)&format);
                cmCTestGenericHandler::AddPersistentMultiOption
                          (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                           (string *)&repeatRegex,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + *i);
                std::__cxx11::string::~string((string *)&repeatRegex);
                _Var2._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&repeatRegex,"ExcludeLabelRegularExpression",
                           (allocator<char> *)&format);
                cmCTestGenericHandler::AddPersistentMultiOption
                          ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                           (string *)&repeatRegex,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + *i);
              }
              else {
                varg1_05._M_str = "--exclude-regex";
                varg1_05._M_len = (size_t)"-E";
                bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_05,in_R8._M_p);
                if ((bVar3) &&
                   (*i < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                  *i = *i + 1;
                  _Var2._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&repeatRegex,"ExcludeRegularExpression",
                             (allocator<char> *)&format);
                  cmCTestGenericHandler::SetPersistentOption
                            (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                             (string *)&repeatRegex,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&repeatRegex);
                  _Var2._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&repeatRegex,"ExcludeRegularExpression",
                             (allocator<char> *)&format);
                  cmCTestGenericHandler::SetPersistentOption
                            ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                             (string *)&repeatRegex,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                }
                else {
                  varg1_06._M_str = "--fixture-exclude-any";
                  varg1_06._M_len = (size_t)"-FA";
                  bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x3,varg1_06,in_R8._M_p);
                  if ((bVar3) &&
                     (*i < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                    *i = *i + 1;
                    _Var2._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&repeatRegex,"ExcludeFixtureRegularExpression",
                               (allocator<char> *)&format);
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)&repeatRegex,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    std::__cxx11::string::~string((string *)&repeatRegex);
                    _Var2._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&repeatRegex,"ExcludeFixtureRegularExpression",
                               (allocator<char> *)&format);
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                               (string *)&repeatRegex,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  }
                  else {
                    varg1_07._M_str = "--fixture-exclude-setup";
                    varg1_07._M_len = (size_t)"-FS";
                    bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x3,varg1_07,in_R8._M_p);
                    if ((bVar3) &&
                       (*i < ((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                      *i = *i + 1;
                      _Var2._M_head_impl =
                           (this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&repeatRegex,"ExcludeFixtureSetupRegularExpression",
                                 (allocator<char> *)&format);
                      cmCTestGenericHandler::SetPersistentOption
                                (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                                 (string *)&repeatRegex,
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                      std::__cxx11::string::~string((string *)&repeatRegex);
                      _Var2._M_head_impl =
                           (this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&repeatRegex,"ExcludeFixtureSetupRegularExpression",
                                 (allocator<char> *)&format);
                      cmCTestGenericHandler::SetPersistentOption
                                ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                                 (string *)&repeatRegex,
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    }
                    else {
                      varg1_08._M_str = "--fixture-exclude-cleanup";
                      varg1_08._M_len = (size_t)"-FC";
                      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x3,varg1_08,in_R8._M_p);
                      if ((bVar3) &&
                         (*i < ((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                        *i = *i + 1;
                        _Var2._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&repeatRegex,"ExcludeFixtureCleanupRegularExpression",
                                   (allocator<char> *)&format);
                        cmCTestGenericHandler::SetPersistentOption
                                  (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                                   (string *)&repeatRegex,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                        std::__cxx11::string::~string((string *)&repeatRegex);
                        _Var2._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&repeatRegex,"ExcludeFixtureCleanupRegularExpression",
                                   (allocator<char> *)&format);
                        cmCTestGenericHandler::SetPersistentOption
                                  ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                                   (string *)&repeatRegex,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                      }
                      else {
                        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x14,
                                              (string_view)ZEXT816(0x691118),in_R8._M_p);
                        if ((!bVar3) ||
                           (((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i)) {
                          bVar4 = CheckArgument((cmCTest *)&arg,(string *)0xe,
                                                (string_view)ZEXT816(0x69112d),in_R8._M_p);
                          bVar3 = true;
                          if (bVar4) {
                            _Var2._M_head_impl =
                                 (this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&repeatRegex,"RerunFailed",
                                       (allocator<char> *)&format);
                            cmCTestGenericHandler::SetPersistentOption
                                      (&((_Var2._M_head_impl)->TestHandler).
                                        super_cmCTestGenericHandler,(string *)&repeatRegex,"true");
                            std::__cxx11::string::~string((string *)&repeatRegex);
                            _Var2._M_head_impl =
                                 (this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&repeatRegex,"RerunFailed",
                                       (allocator<char> *)&format);
                            cmCTestGenericHandler::SetPersistentOption
                                      ((cmCTestGenericHandler *)
                                       &(_Var2._M_head_impl)->MemCheckHandler,(string *)&repeatRegex
                                       ,"true");
                            std::__cxx11::string::~string((string *)&repeatRegex);
                          }
                          goto LAB_0044c4d9;
                        }
                        *i = *i + 1;
                        _Var2._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&repeatRegex,"ResourceSpecFile",
                                   (allocator<char> *)&format);
                        cmCTestGenericHandler::SetPersistentOption
                                  (&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                                   (string *)&repeatRegex,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                        std::__cxx11::string::~string((string *)&repeatRegex);
                        _Var2._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&repeatRegex,"ResourceSpecFile",
                                   (allocator<char> *)&format);
                        cmCTestGenericHandler::SetPersistentOption
                                  ((cmCTestGenericHandler *)&(_Var2._M_head_impl)->MemCheckHandler,
                                   (string *)&repeatRegex,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&repeatRegex);
    }
    bVar3 = true;
    goto LAB_0044c4d9;
  }
  varg1._M_str = "--parallel";
  varg1._M_len = (size_t)"-j";
  bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1,in_R8._M_p);
  if (bVar3) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar7 = *i + 1;
      *i = sVar7;
      iVar5 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
      iVar6 = 1;
      if (1 < iVar5) {
        iVar6 = iVar5;
      }
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var2._M_head_impl)->ParallelLevel = iVar6;
      (_Var2._M_head_impl)->ParallelLevelSetInCli = true;
      goto LAB_0044bab2;
    }
  }
  str._M_str = arg._M_dataplus._M_p;
  str._M_len = arg._M_string_length;
  prefix._M_str = "-j";
  prefix._M_len = 2;
  bVar3 = cmHasPrefix(str,prefix);
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&repeatRegex,(ulong)&arg);
    iVar5 = atoi(repeatRegex.regmatch.startp[0]);
    std::__cxx11::string::~string((string *)&repeatRegex);
    iVar6 = 1;
    if (1 < iVar5) {
      iVar6 = iVar5;
    }
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    (_Var2._M_head_impl)->ParallelLevel = iVar6;
    (_Var2._M_head_impl)->ParallelLevelSetInCli = true;
    goto LAB_0044bab2;
  }
  bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000013,(string_view)ZEXT816(0x690c2c),
                        in_R8._M_p);
  if (bVar3) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i) ||
       (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode != Never))
    goto LAB_0044c4cf;
    sVar7 = *i + 1;
    *i = sVar7;
    repeat = 1;
    bVar3 = cmStrToLong(pbVar1 + sVar7,&repeat);
    if (bVar3) {
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var2._M_head_impl)->RepeatCount = (int)repeat;
      if (1 < repeat) {
        (_Var2._M_head_impl)->RepeatMode = UntilFail;
      }
      goto LAB_0044bab2;
    }
    repeatRegex.regmatch.startp[0] = (char *)0x2f;
    repeatRegex.regmatch.startp[1] = "\'--repeat-until-fail\' given non-integer value \'";
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    format._M_string_length = (size_type)pbVar1[*i]._M_dataplus._M_p;
    format._M_dataplus._M_p = (pointer)pbVar1[*i]._M_string_length;
    cmStrCat<char[2]>((string *)&load,(cmAlphaNum *)&repeatRegex,(cmAlphaNum *)&format,
                      (char (*) [2])0x6825a4);
LAB_0044bd1c:
    this_00 = (RegularExpression *)&load;
LAB_0044bd24:
    std::__cxx11::string::operator=((string *)errormsg,(string *)this_00);
LAB_0044bd2f:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x8,(string_view)ZEXT816(0x690cc6),in_R8._M_p);
    if (!bVar3) {
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_0000000b,(string_view)ZEXT816(0x690d41),
                            in_R8._M_p);
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          bVar3 = cmStrToULong(pbVar1 + sVar7,&load);
          if (bVar3) {
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestLoad = load;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&repeatRegex);
            poVar8 = std::operator<<((ostream *)&repeatRegex,"Invalid value for \'Test Load\' : ");
            poVar8 = std::operator<<(poVar8,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + *i));
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__cxx11::stringbuf::str();
            in_R8._M_p = format._M_dataplus._M_p;
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0x7a2,format._M_dataplus._M_p,false);
            std::__cxx11::string::~string((string *)&format);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&repeatRegex);
          }
          goto LAB_0044bab2;
        }
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x14,(string_view)ZEXT816(0x690d4d),in_R8._M_p
                           );
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CompressTestOutput = false;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xe,(string_view)ZEXT816(0x690d62),in_R8._M_p)
      ;
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->PrintLabels = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000009,(string_view)ZEXT816(0x690d71),
                            in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->UseHTTP10 = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000009,(string_view)ZEXT816(0x690d7b),
                            in_R8._M_p);
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          cVar11.__r = atof(pbVar1[sVar7]._M_dataplus._M_p);
          (((this->Impl)._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->GlobalTimeout).__r =
               cVar11.__r;
          goto LAB_0044bab2;
        }
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_0000000b,(string_view)ZEXT816(0x690d85),
                            in_R8._M_p);
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          SetStopTime(this,pbVar1 + sVar7);
          goto LAB_0044bab2;
        }
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000011,(string_view)ZEXT816(0x690d91),
                            in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->StopOnFailure = true;
        goto LAB_0044bab2;
      }
      varg1_09._M_str = "--build-config";
      varg1_09._M_len = (size_t)"-C";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_09,in_R8._M_p);
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          SetConfigType(this,pbVar1 + sVar7);
          goto LAB_0044bab2;
        }
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x7,(string_view)ZEXT816(0x690db2),in_R8._M_p)
      ;
      if (bVar3) {
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->Debug = true;
        (_Var2._M_head_impl)->ShowLineNumbers = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x7,(string_view)ZEXT816(0x690dba),in_R8._M_p)
      ;
      if (((bVar3) ||
          (bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x7,(string_view)ZEXT816(0x690dc2),
                                 in_R8._M_p), bVar3)) &&
         (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        *i = *i + 1;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SpecificGroup)
        ;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000013,(string_view)ZEXT816(0x690dca),
                            in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowLineNumbers = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x12,(string_view)ZEXT816(0x690dde),in_R8._M_p
                           );
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->LabelSummary = false;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x17,(string_view)ZEXT816(0x690df1),in_R8._M_p
                           );
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubprojectSummary = false;
        goto LAB_0044bab2;
      }
      varg1_10._M_str = "--quiet";
      varg1_10._M_len = (size_t)"-Q";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_10,in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Quiet = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xa,(string_view)ZEXT816(0x690e14),in_R8._M_p)
      ;
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestProgressOutput = true;
        goto LAB_0044bab2;
      }
      varg1_11._M_str = "--verbose";
      varg1_11._M_len = (size_t)"-V";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_11,in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Verbose = true;
        goto LAB_0044bab2;
      }
      varg1_12._M_str = "--extra-verbose";
      varg1_12._M_len = (size_t)"-VV";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x3,varg1_12,in_R8._M_p);
      if (bVar3) {
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->Verbose = true;
        (_Var2._M_head_impl)->ExtraVerbose = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000013,(string_view)ZEXT816(0x690e40),
                            in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
        OutputTestOutputOnTestFailure = true;
        goto LAB_0044bab2;
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x19,(string_view)ZEXT816(0x690e54),in_R8._M_p
                           );
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
        goto LAB_0044cce5;
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmStrToLong(pbVar1 + sVar7,(long *)&load);
        if (bVar3) {
          *(int *)((long)&((this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                          TestHandler + 0x1ac) = (int)load;
          goto LAB_0044bab2;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&repeatRegex);
        poVar8 = std::operator<<((ostream *)&repeatRegex,
                                 "Invalid value for \'--test-output-size-passed\': ");
        poVar8 = std::operator<<(poVar8,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + *i));
        std::operator<<(poVar8,"\n");
        std::__cxx11::stringbuf::str();
        in_R8._M_p = format._M_dataplus._M_p;
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x7ec,format._M_dataplus._M_p,false);
LAB_0044cff8:
        std::__cxx11::string::~string((string *)&format);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&repeatRegex);
        goto LAB_0044bab2;
      }
LAB_0044cce5:
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x19,(string_view)ZEXT816(0x690e9e),in_R8._M_p
                           );
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          bVar3 = cmStrToLong(pbVar1 + sVar7,(long *)&load);
          if (bVar3) {
            *(int *)((long)&((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                            TestHandler + 0x1b0) = (int)load;
            goto LAB_0044bab2;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&repeatRegex);
          poVar8 = std::operator<<((ostream *)&repeatRegex,
                                   "Invalid value for \'--test-output-size-failed\': ");
          poVar8 = std::operator<<(poVar8,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + *i));
          std::operator<<(poVar8,"\n");
          std::__cxx11::stringbuf::str();
          in_R8._M_p = format._M_dataplus._M_p;
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x7f8,format._M_dataplus._M_p,false);
          goto LAB_0044cff8;
        }
      }
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000018,(string_view)ZEXT816(0x690ee8),
                            in_R8._M_p);
      if (bVar3) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
        goto LAB_0044cdd9;
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmCTestTestHandler::SetTestOutputTruncation
                          (&((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                            TestHandler,pbVar1 + sVar7);
        if (bVar3) goto LAB_0044bab2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &repeatRegex,"Invalid value for \'--test-output-truncation\': ",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
        this_00 = &repeatRegex;
        goto LAB_0044bd24;
      }
LAB_0044cdd9:
      varg1_13._M_str = "--show-only";
      varg1_13._M_len = (size_t)"-N";
      bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_13,in_R8._M_p);
      if (bVar3) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
        goto LAB_0044bab2;
      }
      str_01._M_str = arg._M_dataplus._M_p;
      str_01._M_len = arg._M_string_length;
      bVar3 = cmHasLiteralPrefix<13ul>(str_01,(char (*) [13])"--show-only=");
      if (!bVar3) {
        varg1_14._M_str = "--output-log";
        varg1_14._M_len = (size_t)"-O";
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_14,in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar7 = *i + 1;
            *i = sVar7;
            SetOutputLogFileName(this,pbVar1 + sVar7);
            goto LAB_0044bab2;
          }
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xe,(string_view)ZEXT816(0x690f7b),
                              in_R8._M_p);
        if (bVar3) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TomorrowTag = true;
          goto LAB_0044bab2;
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x19,(string_view)ZEXT816(0x678ad1),
                              in_R8._M_p);
        if (bVar3) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess =
               true;
          goto LAB_0044bab2;
        }
        varg1_15._M_str = "--max-width";
        varg1_15._M_len = (size_t)"-W";
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_15,in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar7 = *i + 1;
            *i = sVar7;
            iVar6 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->MaxTestNameWidth =
                 iVar6;
            goto LAB_0044bab2;
          }
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000018,(string_view)ZEXT816(0x690f96)
                              ,in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          value._M_str = (char *)(((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1
                                  >> 5) - 1);
          if ((char *)*i < value._M_str) {
            pcVar9 = (char *)*i + 1;
            *i = (size_t)pcVar9;
            value._M_len = (size_t)pbVar1[(long)pcVar9]._M_dataplus._M_p;
            bVar3 = cmValue::IsOn((cmValue *)pbVar1[(long)pcVar9]._M_string_length,value);
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->InteractiveDebugMode =
                 bVar3;
            goto LAB_0044bab2;
          }
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xe,(string_view)ZEXT816(0x690faf),
                              in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar7 = *i + 1;
            *i = sVar7;
            iVar5 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
            iVar6 = 0;
            if (0 < iVar5) {
              iVar6 = iVar5;
            }
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubmitIndex = iVar6;
            goto LAB_0044bab2;
          }
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)&DAT_0000000b,(string_view)ZEXT816(0x690fbe)
                              ,in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar7 = *i + 1;
            *i = sVar7;
            AddCTestConfigurationOverwrite(this,pbVar1 + sVar7);
            goto LAB_0044bab2;
          }
        }
        varg1_16._M_str = "--add-notes";
        varg1_16._M_len = (size_t)"-A";
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1_16,in_R8._M_p);
        if ((bVar3) &&
           (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&repeatRegex,"Notes",(allocator<char> *)&format);
          SetTest(this,(string *)&repeatRegex,true);
          std::__cxx11::string::~string((string *)&repeatRegex);
          sVar7 = *i;
          *i = sVar7 + 1;
          bVar3 = true;
          SetNotesFiles(this,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar7 + 1);
          goto LAB_0044c4d9;
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xa,(string_view)ZEXT816(0x690fd6),
                              in_R8._M_p);
        if (bVar3) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
          goto LAB_0044c4cf;
          sVar7 = *i + 1;
          *i = sVar7;
          std::__cxx11::string::string((string *)&repeatRegex,(string *)(pbVar1 + sVar7));
          std::__cxx11::string::operator=
                    ((string *)
                     &((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestDir,
                     (string *)&repeatRegex);
          goto LAB_0044d0db;
        }
        bVar3 = CheckArgument((cmCTest *)&arg,(string *)0xe,(string_view)ZEXT816(0x691003),
                              in_R8._M_p);
        if (!bVar3) goto LAB_0044bab2;
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar7 = *i + 1;
          *i = sVar7;
          std::__cxx11::string::string((string *)&repeatRegex,(string *)(pbVar1 + sVar7));
          SetOutputJUnitFileName(this,(string *)&repeatRegex);
          goto LAB_0044d0db;
        }
LAB_0044c4cf:
        std::__cxx11::string::assign((char *)errormsg);
        goto LAB_0044c4d7;
      }
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repeatRegex,"--show-only=",(allocator<char> *)&format);
      std::__cxx11::string::substr((ulong)&format,(ulong)&arg);
      bVar3 = std::operator==(&format,"json-v1");
      if (bVar3) {
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->Quiet = true;
        (_Var2._M_head_impl)->OutputAsJson = true;
        (_Var2._M_head_impl)->OutputAsJsonVersion = 1;
LAB_0044d0c9:
        std::__cxx11::string::~string((string *)&format);
LAB_0044d0db:
        std::__cxx11::string::~string((string *)&repeatRegex);
        goto LAB_0044bab2;
      }
      bVar3 = std::operator!=(&format,"human");
      if (!bVar3) goto LAB_0044d0c9;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repeat,
                     "\'--show-only=\' given unknown value \'",&format);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repeat,
                     "\'");
      std::__cxx11::string::operator=((string *)errormsg,(string *)&load);
      std::__cxx11::string::~string((string *)&load);
      std::__cxx11::string::~string((string *)&repeat);
      std::__cxx11::string::~string((string *)&format);
      this_00 = &repeatRegex;
      goto LAB_0044bd2f;
    }
    if ((((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i) ||
       (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode != Never))
    goto LAB_0044c4cf;
    *i = *i + 1;
    cmsys::RegularExpression::RegularExpression
              (&repeatRegex,"^(until-fail|until-pass|after-timeout):([0-9]+)$");
    bVar3 = cmsys::RegularExpression::find
                      (&repeatRegex,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
    if (bVar3) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&format,&repeatRegex.regmatch,2);
      repeat = 1;
      cmStrToULong(&format,(unsigned_long *)&repeat);
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatCount = (int)repeat;
      if (1 < (int)repeat) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&load,&repeatRegex.regmatch,1);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&load,"until-fail");
        RVar10 = UntilFail;
        if ((bVar4) ||
           (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&load,"until-pass"), RVar10 = UntilPass, bVar4)) {
LAB_0044c790:
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode = RVar10;
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&load,"after-timeout");
          if (bVar4) {
            RVar10 = AfterTimeout;
            goto LAB_0044c790;
          }
        }
        std::__cxx11::string::~string((string *)&load);
      }
      this_01 = &format;
    }
    else {
      format._M_string_length = (size_type)"\'--repeat\' given invalid value \'";
      format._M_dataplus._M_p = (pointer)0x20;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1f0 = pbVar1[*i]._M_dataplus._M_p;
      load = pbVar1[*i]._M_string_length;
      cmStrCat<char[2]>((string *)&repeat,(cmAlphaNum *)&format,(cmAlphaNum *)&load,
                        (char (*) [2])0x6825a4);
      this_01 = (string *)&repeat;
      std::__cxx11::string::operator=((string *)errormsg,(string *)this_01);
    }
    std::__cxx11::string::~string((string *)this_01);
    cmsys::RegularExpression::~RegularExpression(&repeatRegex);
    if (bVar3) goto LAB_0044bab2;
  }
LAB_0044c4d7:
  bVar3 = false;
LAB_0044c4d9:
  std::__cxx11::string::~string((string *)&arg);
  return bVar3;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F"_s)) {
    this->Impl->Failover = true;
  } else if (this->CheckArgument(arg, "-j"_s, "--parallel") &&
             i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  } else if (cmHasPrefix(arg, "-j")) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  }

  else if (this->CheckArgument(arg, "--repeat-until-fail"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmStrToLong(args[i], &repeat)) {
      errormsg = cmStrCat("'--repeat-until-fail' given non-integer value '",
                          args[i], "'");
      return false;
    }
    this->Impl->RepeatCount = static_cast<int>(repeat);
    if (repeat > 1) {
      this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
    }
  }

  else if (this->CheckArgument(arg, "--repeat"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    cmsys::RegularExpression repeatRegex(
      "^(until-fail|until-pass|after-timeout):([0-9]+)$");
    if (repeatRegex.find(args[i])) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->Impl->RepeatCount = static_cast<int>(n);
      if (this->Impl->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "until-fail") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "until-pass") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "after-timeout") {
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      errormsg = cmStrCat("'--repeat' given invalid value '", args[i], "'");
      return false;
    }
  }

  else if (this->CheckArgument(arg, "--test-load"_s) && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmStrToULong(args[i], &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  else if (this->CheckArgument(arg, "--no-compress-output"_s)) {
    this->Impl->CompressTestOutput = false;
  }

  else if (this->CheckArgument(arg, "--print-labels"_s)) {
    this->Impl->PrintLabels = true;
  }

  else if (this->CheckArgument(arg, "--http1.0"_s)) {
    this->Impl->UseHTTP10 = true;
  }

  else if (this->CheckArgument(arg, "--timeout"_s) && i < args.size() - 1) {
    i++;
    auto timeout = cmDuration(atof(args[i].c_str()));
    this->Impl->GlobalTimeout = timeout;
  }

  else if (this->CheckArgument(arg, "--stop-time"_s) && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  else if (this->CheckArgument(arg, "--stop-on-failure"_s)) {
    this->Impl->StopOnFailure = true;
  }

  else if (this->CheckArgument(arg, "-C"_s, "--build-config") &&
           i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i]);
  }

  else if (this->CheckArgument(arg, "--debug"_s)) {
    this->Impl->Debug = true;
    this->Impl->ShowLineNumbers = true;
  } else if ((this->CheckArgument(arg, "--group"_s) ||
              // This is an undocumented / deprecated option.
              // "Track" has been renamed to "Group".
              this->CheckArgument(arg, "--track"_s)) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SpecificGroup = args[i];
  } else if (this->CheckArgument(arg, "--show-line-numbers"_s)) {
    this->Impl->ShowLineNumbers = true;
  } else if (this->CheckArgument(arg, "--no-label-summary"_s)) {
    this->Impl->LabelSummary = false;
  } else if (this->CheckArgument(arg, "--no-subproject-summary"_s)) {
    this->Impl->SubprojectSummary = false;
  } else if (this->CheckArgument(arg, "-Q"_s, "--quiet")) {
    this->Impl->Quiet = true;
  } else if (this->CheckArgument(arg, "--progress"_s)) {
    this->Impl->TestProgressOutput = true;
  } else if (this->CheckArgument(arg, "-V"_s, "--verbose")) {
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "-VV"_s, "--extra-verbose")) {
    this->Impl->ExtraVerbose = true;
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "--output-on-failure"_s)) {
    this->Impl->OutputTestOutputOnTestFailure = true;
  } else if (this->CheckArgument(arg, "--test-output-size-passed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-size-failed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-truncation"_s) &&
             i < args.size() - 1) {
    i++;
    if (!this->Impl->TestHandler.SetTestOutputTruncation(args[i])) {
      errormsg = "Invalid value for '--test-output-truncation': " + args[i];
      return false;
    }
  } else if (this->CheckArgument(arg, "-N"_s, "--show-only")) {
    this->Impl->ShowOnly = true;
  } else if (cmHasLiteralPrefix(arg, "--show-only=")) {
    this->Impl->ShowOnly = true;

    // Check if a specific format is requested. Defaults to human readable
    // text.
    std::string argWithFormat = "--show-only=";
    std::string format = arg.substr(argWithFormat.length());
    if (format == "json-v1") {
      // Force quiet mode so the only output is the json object model.
      this->Impl->Quiet = true;
      this->Impl->OutputAsJson = true;
      this->Impl->OutputAsJsonVersion = 1;
    } else if (format != "human") {
      errormsg = "'--show-only=' given unknown value '" + format + "'";
      return false;
    }
  }

  else if (this->CheckArgument(arg, "-O"_s, "--output-log") &&
           i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i]);
  }

  else if (this->CheckArgument(arg, "--tomorrow-tag"_s)) {
    this->Impl->TomorrowTag = true;
  } else if (this->CheckArgument(arg, "--force-new-ctest-process"_s)) {
    this->Impl->ForceNewCTestProcess = true;
  } else if (this->CheckArgument(arg, "-W"_s, "--max-width") &&
             i < args.size() - 1) {
    i++;
    this->Impl->MaxTestNameWidth = atoi(args[i].c_str());
  } else if (this->CheckArgument(arg, "--interactive-debug-mode"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->InteractiveDebugMode = cmIsOn(args[i]);
  } else if (this->CheckArgument(arg, "--submit-index"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SubmitIndex = atoi(args[i].c_str());
    if (this->Impl->SubmitIndex < 0) {
      this->Impl->SubmitIndex = 0;
    }
  }

  else if (this->CheckArgument(arg, "--overwrite"_s) && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  } else if (this->CheckArgument(arg, "-A"_s, "--add-notes") &&
             i < args.size() - 1) {
    this->Impl->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i]);
    return true;
  } else if (this->CheckArgument(arg, "--test-dir"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--test-dir' requires an argument";
      return false;
    }
    i++;
    this->Impl->TestDir = std::string(args[i]);
  } else if (this->CheckArgument(arg, "--output-junit"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--output-junit' requires an argument";
      return false;
    }
    i++;
    this->SetOutputJUnitFileName(std::string(args[i]));
  }

  cm::string_view noTestsPrefix = "--no-tests=";
  if (cmHasPrefix(arg, noTestsPrefix)) {
    cm::string_view noTestsMode =
      cm::string_view(arg).substr(noTestsPrefix.length());
    if (noTestsMode == "error") {
      this->Impl->NoTestsMode = cmCTest::NoTests::Error;
    } else if (noTestsMode != "ignore") {
      errormsg =
        cmStrCat("'--no-tests=' given unknown value '", noTestsMode, '\'');
      return false;
    } else {
      this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
    }
  }

  // options that control what tests are run
  else if (this->CheckArgument(arg, "-I"_s, "--tests-information") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("TestsToRunInformation",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("TestsToRunInformation",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-U"_s, "--union")) {
    this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
    this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
  } else if (this->CheckArgument(arg, "-R"_s, "--tests-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("IncludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("IncludeRegularExpression",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-L"_s, "--label-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption("LabelRegularExpression",
                                                     args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "LabelRegularExpression", args[i]);
  } else if (this->CheckArgument(arg, "-LE"_s, "--label-exclude") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
  }

  else if (this->CheckArgument(arg, "-E"_s, "--exclude-regex") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "-FA"_s, "--fixture-exclude-any") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FS"_s, "--fixture-exclude-setup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FC"_s, "--fixture-exclude-cleanup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--resource-spec-file"_s) &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ResourceSpecFile",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ResourceSpecFile",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--rerun-failed"_s)) {
    this->GetTestHandler()->SetPersistentOption("RerunFailed", "true");
    this->GetMemCheckHandler()->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}